

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigApi.c
# Opt level: O0

Fraig_Node_t * Fraig_ManReadIthVar(Fraig_Man_t *p,int i)

{
  int local_20;
  int k;
  int i_local;
  Fraig_Man_t *p_local;
  
  if (i < 0) {
    printf("Requesting a PI with a negative number\n");
    p_local = (Fraig_Man_t *)0x0;
  }
  else {
    if (p->vInputs->nSize <= i) {
      for (local_20 = p->vInputs->nSize; local_20 <= i; local_20 = local_20 + 1) {
        Fraig_NodeCreatePi(p);
      }
    }
    p_local = (Fraig_Man_t *)p->vInputs->pArray[i];
  }
  return (Fraig_Node_t *)p_local;
}

Assistant:

Fraig_Node_t * Fraig_ManReadIthVar( Fraig_Man_t * p, int i )
{
    int k;
    if ( i < 0 )
    {
        printf( "Requesting a PI with a negative number\n" );
        return NULL;
    }
    // create the PIs to fill in the interval
    if ( i >= p->vInputs->nSize )
        for ( k = p->vInputs->nSize; k <= i; k++ )
            Fraig_NodeCreatePi( p ); 
    return p->vInputs->pArray[i];
}